

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall
QHttpThreadDelegate::synchronousFinishedWithErrorSlot
          (QHttpThreadDelegate *this,NetworkError errorCode,QString *detail)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x150) != 0) {
    *(NetworkError *)(this + 0xf0) = errorCode;
    QString::operator=((QString *)(this + 0xf8),(QString *)detail);
    QHttpNetworkReply::readAll((QByteArray *)&local_38,*(QHttpNetworkReply **)(this + 0x150));
    pDVar2 = *(Data **)(this + 0x98);
    pcVar3 = *(char **)(this + 0xa0);
    *(Data **)(this + 0x98) = local_38.d;
    *(char **)(this + 0xa0) = local_38.ptr;
    qVar1 = *(qsizetype *)(this + 0xa8);
    *(qsizetype *)(this + 0xa8) = local_38.size;
    local_38.d = pDVar2;
    local_38.ptr = pcVar3;
    local_38.size = qVar1;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
    QMetaObject::invokeMethod<>(*(QObject **)(this + 0x150),"deleteLater",QueuedConnection);
    QMetaObject::invokeMethod<>(*(QObject **)(this + 0x158),"quit",QueuedConnection);
    *(undefined8 *)(this + 0x150) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::synchronousFinishedWithErrorSlot(QNetworkReply::NetworkError errorCode, const QString &detail)
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::synchronousFinishedWithErrorSlot() thread=" << QThread::currentThreadId() << "error=" << errorCode << detail;
#endif
    incomingErrorCode = errorCode;
    incomingErrorDetail = detail;

    synchronousDownloadData = httpReply->readAll();

    QMetaObject::invokeMethod(httpReply, "deleteLater", Qt::QueuedConnection);
    QMetaObject::invokeMethod(synchronousRequestLoop, "quit", Qt::QueuedConnection);
    httpReply = nullptr;
}